

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

ExprList * sqlite3ExprListAppend(Parse *pParse,ExprList *pList,Expr *pExpr)

{
  int iVar1;
  sqlite3 *db_00;
  Expr *pEVar2;
  ExprList *pNew;
  sqlite3 *db;
  ExprList_item *pItem;
  Expr *pExpr_local;
  ExprList *pList_local;
  Parse *pParse_local;
  
  db_00 = pParse->db;
  if (pList == (ExprList *)0x0) {
    pExpr_local = (Expr *)sqlite3DbMallocRawNN(db_00,0x28);
    if (pExpr_local == (Expr *)0x0) {
      pEVar2 = (Expr *)0x0;
LAB_0016617c:
      pExpr_local = pEVar2;
      sqlite3ExprDelete(db_00,pExpr);
      sqlite3ExprListDelete(db_00,(ExprList *)pExpr_local);
      return (ExprList *)0x0;
    }
    pExpr_local->op = '\0';
    pExpr_local->affinity = '\0';
    *(undefined2 *)&pExpr_local->field_0x2 = 0;
  }
  else {
    pExpr_local = (Expr *)pList;
    if (((pList->nExpr & pList->nExpr - 1U) == 0) &&
       (pExpr_local = (Expr *)sqlite3DbRealloc(db_00,pList,
                                               (long)(pList->nExpr * 2 + -1) * 0x20 + 0x28),
       pEVar2 = (Expr *)pList, pExpr_local == (Expr *)0x0)) goto LAB_0016617c;
  }
  iVar1 = *(int *)pExpr_local;
  *(int *)pExpr_local = iVar1 + 1;
  memset(&pExpr_local->u + (long)iVar1 * 4 + 1,0,0x18);
  (&pExpr_local->u)[(long)iVar1 * 4].zToken = (char *)pExpr;
  return (ExprList *)pExpr_local;
}

Assistant:

SQLITE_PRIVATE ExprList *sqlite3ExprListAppend(
  Parse *pParse,          /* Parsing context */
  ExprList *pList,        /* List to which to append. Might be NULL */
  Expr *pExpr             /* Expression to be appended. Might be NULL */
){
  struct ExprList_item *pItem;
  sqlite3 *db = pParse->db;
  assert( db!=0 );
  if( pList==0 ){
    pList = sqlite3DbMallocRawNN(db, sizeof(ExprList) );
    if( pList==0 ){
      goto no_mem;
    }
    pList->nExpr = 0;
  }else if( (pList->nExpr & (pList->nExpr-1))==0 ){
    ExprList *pNew;
    pNew = sqlite3DbRealloc(db, pList, 
             sizeof(*pList)+(2*pList->nExpr - 1)*sizeof(pList->a[0]));
    if( pNew==0 ){
      goto no_mem;
    }
    pList = pNew;
  }
  pItem = &pList->a[pList->nExpr++];
  assert( offsetof(struct ExprList_item,zName)==sizeof(pItem->pExpr) );
  assert( offsetof(struct ExprList_item,pExpr)==0 );
  memset(&pItem->zName,0,sizeof(*pItem)-offsetof(struct ExprList_item,zName));
  pItem->pExpr = pExpr;
  return pList;

no_mem:     
  /* Avoid leaking memory if malloc has failed. */
  sqlite3ExprDelete(db, pExpr);
  sqlite3ExprListDelete(db, pList);
  return 0;
}